

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O1

size_t __thiscall pstore::repo::generic_section::size_bytes(generic_section *this)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  size_t sVar4;
  size_t sVar5;
  container<unsigned_char> cVar6;
  container<pstore::repo::external_fixup> local_48;
  container<pstore::repo::internal_fixup> local_38;
  container<unsigned_char> local_28;
  
  local_28 = payload(this);
  sVar1 = container<unsigned_char>::size(&local_28);
  cVar6 = payload(this);
  local_38.begin_ = (const_pointer)((ulong)(cVar6.end_ + 7) & 0xfffffffffffffff8);
  local_38.end_ = local_38.begin_ + ((this->field_0).field32_ >> 8);
  sVar2 = container<pstore::repo::internal_fixup>::size(&local_38);
  cVar6 = payload(this);
  local_48.begin_ =
       (const_pointer)
       ((ulong)(cVar6.end_ + (ulong)((this->field_0).field32_ >> 8) * 0x18 + 7) & 0xfffffffffffffff8
       );
  local_48.end_ = local_48.begin_ + this->num_xfixups_;
  sVar3 = container<pstore::repo::external_fixup>::size(&local_48);
  if (sVar2 == 0) {
    sVar5 = sVar1 + 0x10;
  }
  else {
    sVar5 = (sVar1 + 0x17 & 0xfffffffffffffff8) + sVar2 * 0x18;
  }
  sVar4 = sVar3 * 0x20 + (sVar5 + 7 & 0xfffffffffffffff8);
  if (sVar3 == 0) {
    sVar4 = sVar5;
  }
  return sVar4;
}

Assistant:

std::size_t generic_section::size_bytes () const {
            return generic_section::size_bytes (payload ().size (), ifixups ().size (),
                                                xfixups ().size ());
        }